

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::js::api::json::PsbtScriptData::ConvertFromStruct
          (PsbtScriptData *this,PsbtScriptDataStruct *data)

{
  PsbtScriptDataStruct *data_local;
  PsbtScriptData *this_local;
  
  std::__cxx11::string::operator=((string *)&this->asm__,(string *)data);
  std::__cxx11::string::operator=((string *)&this->hex_,(string *)&data->hex);
  std::__cxx11::string::operator=((string *)&this->type_,(string *)&data->type);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignore_items,&data->ignore_items);
  return;
}

Assistant:

void PsbtScriptData::ConvertFromStruct(
    const PsbtScriptDataStruct& data) {
  asm__ = data.asm_;
  hex_ = data.hex;
  type_ = data.type;
  ignore_items = data.ignore_items;
}